

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-base.h
# Opt level: O0

void __thiscall mp::BasicSolver::~BasicSolver(BasicSolver *this)

{
  BasicSolver *in_RDI;
  
  ~BasicSolver(in_RDI);
  operator_delete(in_RDI,0x2e8);
  return;
}

Assistant:

virtual ~BasicSolver() { }